

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O2

void Ifn_NtkMatchPrintPerm(word Perm,int nInps)

{
  int iVar1;
  bool bVar2;
  
  if (nInps < 0x11) {
    iVar1 = 0;
    if (nInps < 1) {
      nInps = iVar1;
    }
    while (bVar2 = nInps != 0, nInps = nInps + -1, bVar2) {
      putchar(((uint)(Perm >> ((byte)iVar1 & 0x3c)) & 0xf) + 0x61);
      iVar1 = iVar1 + 4;
    }
    putchar(10);
    return;
  }
  __assert_fail("nInps <= 16",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifTune.c"
                ,0x52b,"void Ifn_NtkMatchPrintPerm(word, int)");
}

Assistant:

void Ifn_NtkMatchPrintPerm( word Perm, int nInps )
{
    int i;
    assert( nInps <= 16 );
    for ( i = 0; i < nInps; i++ )
        printf( "%c", 'a' + Abc_TtGetHex(&Perm, i) );
    printf( "\n" );
}